

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_add_array_item(AMQP_VALUE value,AMQP_VALUE array_item_value)

{
  uint uVar1;
  void *pvVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x766;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x766;
    }
    pcVar6 = "NULL value";
    iVar4 = 0x765;
  }
  else if (value->type == AMQP_TYPE_ARRAY) {
    if ((value->value).binary_value.length == 0) {
      amqpvalue_clone(array_item_value);
      if (array_item_value == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        iVar5 = 0x784;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x784;
        }
        pcVar6 = "Cannot clone value to put in the array";
        iVar4 = 0x783;
        goto LAB_00144f02;
      }
    }
    else {
      if (array_item_value->type != (*(value->value).list_value.items)->type) {
        p_Var3 = xlogging_get_log_function();
        iVar5 = 0x779;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x779;
        }
        pcVar6 = "Cannot put different types in the same array";
        iVar4 = 0x778;
        goto LAB_00144f02;
      }
      amqpvalue_clone(array_item_value);
    }
    pvVar2 = realloc((value->value).binary_value.bytes,
                     (ulong)(value->value).binary_value.length * 8 + 8);
    if (pvVar2 != (void *)0x0) {
      (value->value).binary_value.bytes = pvVar2;
      uVar1 = (value->value).binary_value.length;
      *(AMQP_VALUE *)((long)pvVar2 + (ulong)uVar1 * 8) = array_item_value;
      (value->value).binary_value.length = uVar1 + 1;
      return 0;
    }
    amqpvalue_destroy(array_item_value);
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x792;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x792;
    }
    pcVar6 = "Cannot resize array, size:%zu";
    iVar4 = 0x791;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x76f;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x76f;
    }
    pcVar6 = "Value is not of type ARRAY";
    iVar4 = 0x76e;
  }
LAB_00144f02:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_add_array_item",iVar4,1,pcVar6);
  return iVar5;
}

Assistant:

int amqpvalue_add_array_item(AMQP_VALUE value, AMQP_VALUE array_item_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_409: [ If `value` or `array_item_value` is NULL, amqpvalue_add_array_item shall fail and return a non-zero value. ]*/
    if (value == NULL)
    {
        LogError("NULL value");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_413: [ If the `value` argument is not an AMQP array created with the `amqpvalue_create_array` function than `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_ARRAY)
        {
            LogError("Value is not of type ARRAY");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_425: [ If the type of `array_item_value` does not match that of items already in the array then `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
            AMQP_VALUE_DATA* array_item_value_data = (AMQP_VALUE_DATA*)array_item_value;
            if ((value_data->value.array_value.count > 0) &&
                (array_item_value_data->type != value_data->value.array_value.items[0]->type))
            {
                LogError("Cannot put different types in the same array");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_410: [ The item stored at the n-th position in the array shall be a clone of `array_item_value`. ] */
                AMQP_VALUE cloned_item = amqpvalue_clone(array_item_value);
                if (cloned_item == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_423: [ When `amqpvalue_add_array_item` fails due to not being able to clone the item or grow the array, the array shall not be altered. ] */
                    /* Codes_SRS_AMQPVALUE_01_412: [ If cloning the item fails, `amqpvalue_add_array_item` shall fail and return a non-zero value. ]*/
                    LogError("Cannot clone value to put in the array");
                    result = MU_FAILURE;
                }
                else
                {
                    AMQP_VALUE* new_array;
                    size_t realloc_size = safe_add_size_t((size_t)value_data->value.array_value.count, 1);
                    realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_VALUE));
                    if (realloc_size == SIZE_MAX ||
                        (new_array = (AMQP_VALUE*)realloc(value_data->value.array_value.items, realloc_size)) == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_423: [ When `amqpvalue_add_array_item` fails due to not being able to clone the item or grow the array, the array shall not be altered. ] */
                        /* Codes_SRS_AMQPVALUE_01_424: [ If growing the array fails, then `amqpvalue_add_array_item` shall fail and return a non-zero value. ] */
                        amqpvalue_destroy(cloned_item);
                        LogError("Cannot resize array, size:%zu", realloc_size);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        value_data->value.array_value.items = new_array;

                        /* Codes_SRS_AMQPVALUE_01_407: [ `amqpvalue_add_array_item` shall add the AMQP_VALUE specified by `array_item_value` at the 0 based n-th position in the array. ]*/
                        value_data->value.array_value.items[value_data->value.array_value.count] = cloned_item;
                        value_data->value.array_value.count++;

                        /* Codes_SRS_AMQPVALUE_01_408: [ On success `amqpvalue_add_array_item` shall return 0. ]*/
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}